

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int fts3ExprLocalHitsCb(Fts3Expr *pExpr,int iPhrase,void *pCtx)

{
  int iVar1;
  char *local_40;
  char *pCsr;
  int i;
  int iStart;
  MatchInfo *p;
  void *pvStack_20;
  int rc;
  void *pCtx_local;
  Fts3Expr *pFStack_10;
  int iPhrase_local;
  Fts3Expr *pExpr_local;
  
  p._4_4_ = 0;
  pCsr._4_4_ = iPhrase * *(int *)((long)pCtx + 8) * 3;
  _i = (undefined8 *)pCtx;
  pvStack_20 = pCtx;
  pCtx_local._4_4_ = iPhrase;
  pFStack_10 = pExpr;
  for (pCsr._0_4_ = 0; (int)pCsr < *(int *)(_i + 1) && p._4_4_ == 0; pCsr._0_4_ = (int)pCsr + 1) {
    p._4_4_ = sqlite3Fts3EvalPhrasePoslist((Fts3Cursor *)*_i,pFStack_10,(int)pCsr,&local_40);
    if (local_40 == (char *)0x0) {
      *(undefined4 *)(_i[4] + (long)(pCsr._4_4_ + (int)pCsr * 3) * 4) = 0;
    }
    else {
      iVar1 = fts3ColumnlistCount(&local_40);
      *(int *)(_i[4] + (long)(pCsr._4_4_ + (int)pCsr * 3) * 4) = iVar1;
    }
  }
  return p._4_4_;
}

Assistant:

static int fts3ExprLocalHitsCb(
  Fts3Expr *pExpr,                /* Phrase expression node */
  int iPhrase,                    /* Phrase number */
  void *pCtx                      /* Pointer to MatchInfo structure */
){
  int rc = SQLITE_OK;
  MatchInfo *p = (MatchInfo *)pCtx;
  int iStart = iPhrase * p->nCol * 3;
  int i;

  for(i=0; i<p->nCol && rc==SQLITE_OK; i++){
    char *pCsr;
    rc = sqlite3Fts3EvalPhrasePoslist(p->pCursor, pExpr, i, &pCsr);
    if( pCsr ){
      p->aMatchinfo[iStart+i*3] = fts3ColumnlistCount(&pCsr);
    }else{
      p->aMatchinfo[iStart+i*3] = 0;
    }
  }

  return rc;
}